

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<int>::Subst_LBackward(TPZMatrix<int> *this,TPZFMatrix<int> *B)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  long lVar6;
  int64_t c;
  long lVar7;
  int local_3c;
  TPZMatrix<int> *local_38;
  
  lVar1 = (B->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if ((lVar1 != CONCAT44(extraout_var,iVar2)) || ((this->super_TPZBaseMatrix).fDecomposed != '\x04')
     ) {
    Error("TPZMatrix::Subst_LBackward incompatible dimensions \n",(char *)0x0);
  }
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar1 = CONCAT44(extraout_var_00,iVar2);
  local_38 = this;
  while (lVar5 = lVar1, 0 < lVar5) {
    lVar1 = lVar5 + -1;
    for (lVar7 = 0; lVar7 < (B->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol; lVar7 = lVar7 + 1) {
      iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      lVar6 = CONCAT44(extraout_var_01,iVar2);
      iVar2 = 0;
      while (lVar5 < lVar6) {
        lVar6 = lVar6 + -1;
        iVar3 = (*(local_38->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (local_38,lVar1,lVar6);
        iVar4 = (*(B->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                  [0x24])(B,lVar6,lVar7);
        iVar2 = iVar2 + iVar4 * iVar3;
      }
      local_3c = (*(B->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                   [0x24])(B,lVar1,lVar7);
      local_3c = local_3c - iVar2;
      (*(B->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
                (B,lVar1,lVar7,&local_3c);
      this = local_38;
    }
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt){
		Error("TPZMatrix::Subst_LBackward incompatible dimensions \n");
	}
	
    for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
        for ( int64_t c = 0; c < B->Cols(); c++ ) {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
            //
            TVar sum = 0.0;
            for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = B[r,c] - sum.
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}